

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O0

string * __thiscall
kratos::Var::handle_name_abi_cxx11_(string *__return_storage_ptr__,Var *this,Generator *scope)

{
  initializer_list<const_kratos::IRNode_*> __l;
  int iVar1;
  VarException *this_00;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  remove_reference_t<std::__cxx11::basic_string<char>_> *in_R8;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  string_view format_str;
  format_args args;
  allocator<const_kratos::IRNode_*> local_189;
  Var *local_188;
  Generator *local_180;
  undefined8 local_178;
  Var **local_170;
  size_type local_168;
  vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> local_160;
  string local_148;
  string local_128;
  long local_108;
  size_type pos;
  string local_f0 [8];
  string var_name;
  string gen_name;
  Generator *scope_local;
  Var *this_local;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  local_98;
  basic_string_view<char> local_88;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_78;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_58;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *vargs;
  char (*local_48) [31];
  char *local_40;
  string *local_38;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_30;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_28;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_20;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_18;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_10;
  
  Generator::handle_name_abi_cxx11_((string *)((long)&var_name.field_2 + 8),scope);
  (*(this->super_IRNode)._vptr_IRNode[0x20])(local_f0);
  local_108 = std::__cxx11::string::find(local_f0,(ulong)((long)&var_name.field_2 + 8));
  if (local_108 != 0) {
    this_00 = (VarException *)__cxa_allocate_exception(0x10);
    iVar1 = (*(this->super_IRNode)._vptr_IRNode[0xd])();
    Generator::handle_name_abi_cxx11_(&local_148,(Generator *)CONCAT44(extraout_var,iVar1));
    local_38 = &local_128;
    local_40 = "{0} is not accessible from {1}";
    local_48 = (char (*) [31])((long)&var_name.field_2 + 8);
    vargs = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_148;
    fmt::v7::make_args_checked<std::__cxx11::string&,std::__cxx11::string,char[31],char>
              (&local_78,(v7 *)"{0} is not accessible from {1}",local_48,
               (remove_reference_t<std::__cxx11::basic_string<char>_&> *)vargs,in_R8);
    local_58 = &local_78;
    local_88 = fmt::v7::to_string_view<char,_0>(local_40);
    local_28 = &local_98;
    local_30 = local_58;
    local_20 = local_58;
    local_10 = local_58;
    local_18 = local_28;
    fmt::v7::
    basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    ::basic_format_args(local_28,0xdd,
                        (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                         *)local_58);
    format_str.size_ = local_98.desc_;
    format_str.data_ = (char *)local_88.size_;
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1.values_ = in_R9.values_;
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = (unsigned_long_long)local_98.field_1.values_;
    fmt::v7::detail::vformat_abi_cxx11_(&local_128,(detail *)local_88.data_,format_str,args);
    local_188 = this;
    local_180 = scope;
    iVar1 = (*(this->super_IRNode)._vptr_IRNode[0xd])();
    local_178 = CONCAT44(extraout_var_00,iVar1);
    local_170 = &local_188;
    local_168 = 3;
    std::allocator<const_kratos::IRNode_*>::allocator(&local_189);
    __l._M_len = local_168;
    __l._M_array = (iterator)local_170;
    std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
              (&local_160,__l,&local_189);
    VarException::VarException(this_00,&local_128,&local_160);
    __cxa_throw(this_00,&VarException::typeinfo,VarException::~VarException);
  }
  std::__cxx11::string::size();
  std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)local_f0);
  std::__cxx11::string::~string(local_f0);
  std::__cxx11::string::~string((string *)(var_name.field_2._M_local_buf + 8));
  return __return_storage_ptr__;
}

Assistant:

std::string Var::handle_name(kratos::Generator *scope) const {
    // subtract the scope
    auto gen_name = scope->handle_name();
    auto var_name = handle_name();
    auto pos = var_name.find(gen_name);
    if (pos != 0) {
        throw VarException(
            ::format("{0} is not accessible from {1}", gen_name, generator()->handle_name()),
            {this, scope, this->generator()});
    }
    // we +1 because there is a dot there
    return var_name.substr(pos + gen_name.size() + 1);
}